

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O2

void Dau_TruthEnum(int nVars)

{
  ulong *puVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int Entry;
  abctime aVar6;
  int *__ptr;
  int *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  Vec_Int_t *p;
  word wVar7;
  abctime aVar8;
  ulong Truth;
  FILE *__s;
  ulong uVar9;
  ulong uVar10;
  abctime time;
  abctime time_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t __nmemb;
  ulong uVar14;
  uint nBits;
  char pFileName [200];
  
  aVar6 = Abc_Clock();
  bVar3 = (byte)nVars & 0x1f;
  nBits = 1 << bVar3;
  uVar5 = Extra_Factorial(nVars);
  __ptr = Extra_PermSchedule(nVars);
  __ptr_00 = Extra_GreyCodeSchedule(nVars);
  uVar12 = 1L << (~(byte)(-1L << ((byte)nVars & 0x3f)) & 0x3f);
  __ptr_01 = calloc((long)(1 << ((char)nBits - 7U & 0x1f)),8);
  __nmemb = (size_t)(1 << ((byte)(nBits - 2) & 0x1f));
  __ptr_02 = calloc(__nmemb,8);
  p = Vec_IntAlloc(1000);
  wVar7 = Abc_Tt6Mask(nBits);
  if (__ptr_01 == (void *)0x0) {
    puts("Cannot alloc memory for marks.");
    return;
  }
  if (__ptr_02 == (void *)0x0) {
    puts("Cannot alloc memory for table.");
  }
  uVar4 = nBits;
  if (1 << bVar3 < 1) {
    uVar4 = 0;
  }
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  uVar13 = 0;
  do {
    if (uVar12 <= uVar13) {
      printf("Computed %d NPN classes of %d variables.  ",(ulong)(uint)p->nSize,(ulong)(uint)nVars);
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar8 - aVar6),time_00);
      fflush(_stdout);
      Vec_IntFree(p);
      free(__ptr_01);
      free(__ptr);
      free(__ptr_00);
      if (__ptr_02 != (void *)0x0) {
        sprintf(pFileName,"tableW%d.data",(ulong)(nBits - 2));
        __s = fopen(pFileName,"wb");
        fwrite(__ptr_02,8,__nmemb,__s);
        fclose(__s);
        free(__ptr_02);
      }
      return;
    }
    if ((uVar13 & 0x3ffff) == 0) {
      printf("Finished %08x.  Classes = %6d.  ",uVar13,(ulong)(uint)p->nSize);
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar8 - aVar6),time);
      fflush(_stdout);
    }
    Entry = (int)uVar13;
    if ((*(ulong *)((long)__ptr_01 + (long)(Entry >> 6) * 8) >> (uVar13 & 0x3f) & 1) == 0) {
      Vec_IntPush(p,Entry);
      Truth = uVar13;
      for (uVar14 = 0; uVar14 != uVar9; uVar14 = uVar14 + 1) {
        for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
          if (Truth < uVar12) {
            if (__ptr_02 != (void *)0x0) {
              *(int *)((long)__ptr_02 + (long)(int)Truth * 4) = Entry;
            }
            puVar1 = (ulong *)((long)__ptr_01 + (long)((int)Truth >> 6) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)Truth & 0x3f);
          }
          uVar10 = ~Truth & wVar7;
          if (uVar10 < uVar12) {
            if (__ptr_02 != (void *)0x0) {
              *(int *)((long)__ptr_02 + (long)(int)uVar10 * 4) = Entry;
            }
            puVar1 = (ulong *)((long)__ptr_01 + (long)((int)uVar10 >> 6) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)uVar10 & 0x3f);
          }
          Truth = Abc_Tt6Flip(Truth,__ptr_00[uVar11]);
        }
        iVar2 = __ptr[uVar14];
        bVar3 = (byte)(1L << ((byte)iVar2 & 0x3f));
        Truth = (Truth & s_PMasks[iVar2][2]) >> (bVar3 & 0x3f) |
                (s_PMasks[iVar2][1] & Truth) << (bVar3 & 0x3f) | s_PMasks[iVar2][0] & Truth;
      }
      if (uVar13 != Truth) {
        __assert_fail("tTemp == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                      ,0x68,"void Dau_TruthEnum(int)");
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Dau_TruthEnum(int nVars)
{
    int fUseTable = 1;
    abctime clk = Abc_Clock();
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    int nPerms  = Extra_Factorial( nVars );
    int nMints  = 1 << nVars;
    int * pPerm = Extra_PermSchedule( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    word nFuncs = ((word)1 << (((word)1 << nVars)-1));
    word * pPres = ABC_CALLOC( word, 1 << ((1<<nVars)-7) );
    unsigned * pTable = fUseTable ? (unsigned *)ABC_CALLOC(word, nSizeW) : NULL;
    Vec_Int_t * vNpns = Vec_IntAlloc( 1000 );
    word tMask = Abc_Tt6Mask( 1 << nVars );
    word tTemp, tCur;
    int i, k;
    if ( pPres == NULL )
    {
        printf( "Cannot alloc memory for marks.\n" );
        return;
    }
    if ( pTable == NULL )
        printf( "Cannot alloc memory for table.\n" );
    for ( tCur = 0; tCur < nFuncs; tCur++ )
    {
        if ( (tCur & 0x3FFFF) == 0 )
        {
            printf( "Finished %08x.  Classes = %6d.  ", (int)tCur, Vec_IntSize(vNpns) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            fflush(stdout);
        }
        if ( Abc_TtGetBit(pPres, (int)tCur) )
            continue;
        //Extra_PrintBinary( stdout, (unsigned *)&tCur, 16 ); printf( " %04x\n", (int)tCur );
        //Dau_DsdPrintFromTruth( &tCur, 4 ); printf( "\n" );
        Vec_IntPush( vNpns, (int)tCur );
        tTemp = tCur;
        for ( i = 0; i < nPerms; i++ )
        {
            for ( k = 0; k < nMints; k++ )
            {
                if ( tCur < nFuncs )
                {
                    if ( pTable ) pTable[(int)tCur] = tTemp;
                    Abc_TtSetBit( pPres, (int)tCur );
                }
                if ( (tMask & ~tCur) < nFuncs )
                {
                    if ( pTable ) pTable[(int)(tMask & ~tCur)] = tTemp;
                    Abc_TtSetBit( pPres, (int)(tMask & ~tCur) );
                }
                tCur = Abc_Tt6Flip( tCur, pComp[k] );
            }
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[i] );
        }
        assert( tTemp == tCur );
    }
    printf( "Computed %d NPN classes of %d variables.  ", Vec_IntSize(vNpns), nVars );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    fflush(stdout);
    Vec_IntFree( vNpns );
    ABC_FREE( pPres );
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // write into file
    if ( pTable )
    {
        FILE * pFile;
        int RetValue;
        char pFileName[200];
        sprintf( pFileName, "tableW%d.data", nSizeLog );
        pFile = fopen( pFileName, "wb" );
        RetValue = fwrite( pTable, 8, nSizeW, pFile );
        RetValue = 0;
        fclose( pFile );
        ABC_FREE( pTable );
    }
}